

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O3

LogicalType * __thiscall
duckdb::TypeVisitor::
VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
          (LogicalType *__return_storage_ptr__,TypeVisitor *this,LogicalType *type,
          anon_class_8_1_669485c1 *func)

{
  TypeVisitor TVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  LogicalType *pLVar4;
  LogicalType *pLVar5;
  idx_t index;
  LogicalType *extraout_RAX;
  LogicalType *extraout_RAX_00;
  LogicalType *extraout_RAX_01;
  uint *func_00;
  long lVar6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  TypeVisitor *pTVar7;
  element_type *peVar8;
  LogicalType value;
  child_list_t<LogicalType> children;
  LogicalType local_d8;
  LogicalType local_c0;
  LogicalType local_a8;
  optional_idx local_90;
  LogicalType local_88;
  LogicalType local_70;
  child_list_t<LogicalType> local_58;
  child_list_t<LogicalType> local_40;
  
  pLVar5 = &local_d8;
  func_00 = &switchD_00d4bcac::switchdataD_01d85bbc;
  switch(*this) {
  case (TypeVisitor)0x64:
    __x = &StructType::GetChildTypes_abi_cxx11_((LogicalType *)this)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_c0,__x);
    if ((element_type *)local_c0._0_8_ !=
        local_c0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pTVar7 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_c0._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
                  (&local_d8,pTVar7,type,(anon_class_8_1_669485c1 *)func_00);
        *pTVar7 = (TypeVisitor)local_d8.id_;
        pTVar7[1] = (TypeVisitor)local_d8.physical_type_;
        peVar8 = *(element_type **)(pTVar7 + 8);
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar7 + 0x10);
        *(element_type **)(pTVar7 + 8) =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar7 + 0x10) =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var3;
        LogicalType::~LogicalType(&local_d8);
        peVar8 = (element_type *)(pTVar7 + 0x18);
        pTVar7 = pTVar7 + 0x38;
      } while (peVar8 != local_c0.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_40,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_c0);
    LogicalType::STRUCT(&local_d8,&local_40);
    plVar2 = *(long **)type;
    if (((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x17) ||
       ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x1d)) {
      lVar6 = *plVar2 + 0x20;
    }
    else if ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0xc8) {
      lVar6 = *plVar2 + 8;
    }
    else {
      lVar6 = *plVar2;
    }
    *plVar2 = lVar6 + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_d8);
    LogicalType::~LogicalType(&local_d8);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_40;
    goto LAB_00d4c108;
  case (TypeVisitor)0x65:
    pLVar5 = ListType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_c0,pLVar5);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_a8,(TypeVisitor *)&local_c0,type,(anon_class_8_1_669485c1 *)func_00);
    LogicalType::LIST(&local_d8,&local_a8);
    plVar2 = *(long **)type;
    if (((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x17) ||
       ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x1d)) {
      lVar6 = *plVar2 + 0x20;
    }
    else if ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0xc8) {
      lVar6 = *plVar2 + 8;
    }
    else {
      lVar6 = *plVar2;
    }
    *plVar2 = lVar6 + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_d8);
    break;
  case (TypeVisitor)0x66:
    pLVar4 = MapType::KeyType((LogicalType *)this);
    LogicalType::LogicalType(&local_c0,pLVar4);
    pLVar4 = MapType::ValueType((LogicalType *)this);
    LogicalType::LogicalType(&local_d8,pLVar4);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_70,(TypeVisitor *)&local_c0,type,(anon_class_8_1_669485c1 *)func_00);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_88,(TypeVisitor *)&local_d8,type,(anon_class_8_1_669485c1 *)func_00);
    LogicalType::MAP(&local_a8,&local_70,&local_88);
    plVar2 = *(long **)type;
    if ((local_a8.physical_type_ == LIST) || (local_a8.physical_type_ == ARRAY)) {
      lVar6 = *plVar2 + 0x20;
    }
    else if (local_a8.physical_type_ == VARCHAR) {
      lVar6 = *plVar2 + 8;
    }
    else {
      lVar6 = *plVar2;
    }
    *plVar2 = lVar6 + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_a8);
    LogicalType::~LogicalType(&local_a8);
    LogicalType::~LogicalType(&local_88);
    LogicalType::~LogicalType(&local_70);
    goto LAB_00d4c0ab;
  default:
    plVar2 = *(long **)type;
    TVar1 = this[1];
    if ((TVar1 == (TypeVisitor)0x17) || (TVar1 == (TypeVisitor)0x1d)) {
      lVar6 = *plVar2 + 0x20;
    }
    else if (TVar1 == (TypeVisitor)0xc8) {
      lVar6 = *plVar2 + 8;
    }
    else {
      lVar6 = *plVar2;
    }
    *plVar2 = lVar6 + 2;
    LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)this);
    return extraout_RAX;
  case (TypeVisitor)0x6b:
    UnionType::CopyMemberTypes_abi_cxx11_
              ((child_list_t<LogicalType> *)&local_c0,(UnionType *)this,type);
    if ((element_type *)local_c0._0_8_ !=
        local_c0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pTVar7 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_c0._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
                  (&local_d8,pTVar7,type,(anon_class_8_1_669485c1 *)func_00);
        *pTVar7 = (TypeVisitor)local_d8.id_;
        pTVar7[1] = (TypeVisitor)local_d8.physical_type_;
        peVar8 = *(element_type **)(pTVar7 + 8);
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar7 + 0x10);
        *(element_type **)(pTVar7 + 8) =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar7 + 0x10) =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8;
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var3;
        LogicalType::~LogicalType(&local_d8);
        peVar8 = (element_type *)(pTVar7 + 0x18);
        pTVar7 = pTVar7 + 0x38;
      } while (peVar8 != local_c0.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_58,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_c0);
    LogicalType::UNION(&local_d8,&local_58);
    plVar2 = *(long **)type;
    if (((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x17) ||
       ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x1d)) {
      lVar6 = *plVar2 + 0x20;
    }
    else if ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0xc8) {
      lVar6 = *plVar2 + 8;
    }
    else {
      lVar6 = *plVar2;
    }
    *plVar2 = lVar6 + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_d8);
    LogicalType::~LogicalType(&local_d8);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_58;
LAB_00d4c108:
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this_00);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_c0);
    return extraout_RAX_01;
  case (TypeVisitor)0x6c:
    pLVar5 = ArrayType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_c0,pLVar5);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_a8,(TypeVisitor *)&local_c0,type,(anon_class_8_1_669485c1 *)func_00);
    index = ArrayType::GetSize((LogicalType *)this);
    optional_idx::optional_idx(&local_90,index);
    LogicalType::ARRAY(&local_d8,&local_a8,local_90);
    plVar2 = *(long **)type;
    if (((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x17) ||
       ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0x1d)) {
      lVar6 = *plVar2 + 0x20;
    }
    else if ((TypeVisitor)local_d8.physical_type_ == (TypeVisitor)0xc8) {
      lVar6 = *plVar2 + 8;
    }
    else {
      lVar6 = *plVar2;
    }
    *plVar2 = lVar6 + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_d8);
  }
  LogicalType::~LogicalType(&local_d8);
  pLVar5 = &local_a8;
LAB_00d4c0ab:
  LogicalType::~LogicalType(pLVar5);
  LogicalType::~LogicalType(&local_c0);
  return extraout_RAX_00;
}

Assistant:

inline LogicalType TypeVisitor::VisitReplace(const LogicalType &type, F &&func) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto children = StructType::GetChildTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::STRUCT(children));
	}
	case LogicalTypeId::UNION: {
		auto children = UnionType::CopyMemberTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::UNION(children));
	}
	case LogicalTypeId::LIST: {
		auto child = ListType::GetChildType(type);
		return func(LogicalType::LIST(VisitReplace(child, func)));
	}
	case LogicalTypeId::ARRAY: {
		auto child = ArrayType::GetChildType(type);
		return func(LogicalType::ARRAY(VisitReplace(child, func), ArrayType::GetSize(type)));
	}
	case LogicalTypeId::MAP: {
		auto key = MapType::KeyType(type);
		auto value = MapType::ValueType(type);
		return func(LogicalType::MAP(VisitReplace(key, func), VisitReplace(value, func)));
	}
	default:
		return func(type);
	}
}